

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.h
# Opt level: O1

void __thiscall hwnet::Poller::Poller(Poller *this)

{
  this->running = (__atomic_base<bool>)0x0;
  this->inited = (__atomic_base<bool>)0x0;
  (this->mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mtx).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mtx).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->channels)._M_h._M_buckets = &(this->channels)._M_h._M_single_bucket;
  (this->channels)._M_h._M_bucket_count = 1;
  (this->channels)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->channels)._M_h._M_element_count = 0;
  (this->channels)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->channels)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->channels)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->poller_).epfd = -1;
  (this->poller_).events = (epoll_event *)0x0;
  (this->poller_).maxevents = 0;
  (this->notifyChannel_).
  super___shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->notifyChannel_).
  super___shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->waitRemove).
  super__List_base<std::shared_ptr<hwnet::Channel>,_std::allocator<std::shared_ptr<hwnet::Channel>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->waitRemove;
  (this->waitRemove).
  super__List_base<std::shared_ptr<hwnet::Channel>,_std::allocator<std::shared_ptr<hwnet::Channel>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->waitRemove;
  (this->waitRemove).
  super__List_base<std::shared_ptr<hwnet::Channel>,_std::allocator<std::shared_ptr<hwnet::Channel>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->closed)._M_base._M_i = false;
  util::TimerRoutine::TimerRoutine(&this->timerRoutine,1);
  (this->clearWaitRemove).super___atomic_base<int>._M_i = 0;
  return;
}

Assistant:

Poller():running(false),inited(false),closed(false),timerRoutine(util::TimerMgr::normal),clearWaitRemove(0){}